

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O0

pssize p_socket_send(PSocket *socket,pchar *buffer,psize buflen,PError **error)

{
  pboolean pVar1;
  pint err_code_00;
  PErrorIO code;
  ssize_t sVar2;
  bool bVar3;
  pint err_code;
  pssize ret;
  PErrorIO sock_err;
  PError **error_local;
  psize buflen_local;
  pchar *buffer_local;
  PSocket *socket_local;
  
  bVar3 = true;
  if ((socket != (PSocket *)0x0) && (bVar3 = true, buffer != (pchar *)0x0)) {
    bVar3 = buflen == 0;
  }
  if (bVar3) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    if (pVar1 != 0) {
      do {
        if (((socket->field_0x18 & 1) != 0) &&
           (pVar1 = p_socket_io_condition_wait(socket,P_SOCKET_IO_CONDITION_POLLOUT,error),
           pVar1 == 0)) {
          return -1;
        }
        sVar2 = send(socket->fd,buffer,buflen & 0xffffffff,0x4000);
        if (-1 < sVar2) {
          return sVar2;
        }
        err_code_00 = p_error_get_last_net();
      } while ((err_code_00 == 4) ||
              ((code = p_error_get_io_from_system(err_code_00), (socket->field_0x18 & 1) != 0 &&
               (code == P_ERROR_IO_WOULD_BLOCK))));
      p_error_set_error_p(error,code,err_code_00,"Failed to call send() on socket");
    }
  }
  return -1;
}

Assistant:

P_LIB_API pssize
p_socket_send (const PSocket	*socket,
	       const pchar	*buffer,
	       psize		buflen,
	       PError		**error)
{
	PErrorIO	sock_err;
	pssize		ret;
	pint		err_code;

	if (P_UNLIKELY (socket == NULL || buffer == NULL || buflen == 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return -1;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return -1;

	for (;;) {
		if (socket->blocking &&
		    p_socket_io_condition_wait (socket,
						P_SOCKET_IO_CONDITION_POLLOUT,
						error) == FALSE)
			return -1;

		if ((ret = send (socket->fd,
				 buffer,
				 (socklen_t) buflen,
				 P_SOCKET_DEFAULT_SEND_FLAGS)) < 0) {
			err_code = p_error_get_last_net ();

#if !defined (P_OS_WIN) && defined (EINTR)
			if (err_code == EINTR)
				continue;
#endif
			sock_err = p_error_get_io_from_system (err_code);

			if (socket->blocking && sock_err == P_ERROR_IO_WOULD_BLOCK)
				continue;

			p_error_set_error_p (error,
					     (pint) sock_err,
					     err_code,
					     "Failed to call send() on socket");

			return -1;
		}

		break;
	}

	return ret;
}